

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  bool bVar5;
  char *pcVar6;
  char *label_00;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  ImGuiColumns *pIVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  float fVar19;
  
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
    return;
  }
  uVar8 = 1;
  if (window->Active == false) {
    uVar8 = (ulong)window->WasActive;
  }
  bVar5 = TreeNode(window,"%s \'%s\', %d @ 0x%p",label,window->Name,uVar8,window);
  if (bVar5) {
    uVar4 = window->Flags;
    NodeDrawList(window,window->DrawList,label_00);
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",
               (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
               (double)(window->Size).y,(double)(window->ContentSize).x,
               (double)(window->ContentSize).y);
    pcVar7 = "Child ";
    if ((uVar4 >> 0x18 & 1) == 0) {
      pcVar7 = "";
    }
    pcVar6 = "Tooltip ";
    if ((uVar4 >> 0x19 & 1) == 0) {
      pcVar6 = "";
    }
    pcVar9 = "Popup ";
    if ((uVar4 >> 0x1a & 1) == 0) {
      pcVar9 = "";
    }
    pcVar10 = "Modal ";
    if ((uVar4 >> 0x1b & 1) == 0) {
      pcVar10 = "";
    }
    pcVar11 = "ChildMenu ";
    if ((uVar4 >> 0x1c & 1) == 0) {
      pcVar11 = "";
    }
    pcVar12 = "NoSavedSettings ";
    if ((uVar4 >> 8 & 1) == 0) {
      pcVar12 = "";
    }
    pcVar15 = "NoMouseInputs";
    if ((uVar4 >> 9 & 1) == 0) {
      pcVar15 = "";
    }
    pcVar17 = "NoNavInputs";
    if ((uVar4 >> 0x12 & 1) == 0) {
      pcVar17 = "";
    }
    pcVar13 = "AlwaysAutoResize";
    if ((uVar4 & 0x40) == 0) {
      pcVar13 = "";
    }
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar4,pcVar7,pcVar6,pcVar9,pcVar10,
               pcVar11,pcVar12,pcVar15,pcVar17,pcVar13);
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)",(double)(window->Scroll).x,
               (double)(window->ScrollMax).x,(double)(window->Scroll).y,
               (double)(window->ScrollMax).y);
    if ((window->Active != false) || (uVar8 = 0xffffffff, window->WasActive != false)) {
      uVar8 = (ulong)(uint)(int)window->BeginOrderWithinContext;
    }
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",(ulong)window->Active
               ,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar8);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
               (ulong)window->Appearing,(ulong)window->Hidden,
               (ulong)(uint)window->HiddenFramesCanSkipItems,
               (ulong)(uint)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
    BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",(ulong)window->NavLastIds[0],
               (ulong)window->NavLastIds[1],(ulong)(uint)(window->DC).NavLayerActiveMask);
    if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
      pcVar7 = "NULL";
    }
    else {
      pcVar7 = window->NavLastChildNavWindow->Name;
    }
    BulletText("NavLastChildNavWindow: %s",pcVar7);
    fVar3 = window->NavRectRel[0].Min.x;
    pIVar1 = &window->NavRectRel[0].Max;
    if ((pIVar1->x <= fVar3 && fVar3 != pIVar1->x) ||
       (fVar19 = window->NavRectRel[0].Min.y, pfVar2 = &window->NavRectRel[0].Max.y,
       *pfVar2 <= fVar19 && fVar19 != *pfVar2)) {
      BulletText("NavRectRel[0]: <None>");
    }
    else {
      BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)fVar3,
                 (double)window->NavRectRel[0].Min.y,(double)window->NavRectRel[0].Max.x,
                 (double)window->NavRectRel[0].Max.y);
    }
    if (window->RootWindow != window) {
      NodeWindow(window->RootWindow,"RootWindow");
    }
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      NodeWindow(window->ParentWindow,"ParentWindow");
    }
    if (0 < (window->DC).ChildWindows.Size) {
      NodeWindows(&(window->DC).ChildWindows,"ChildWindows");
    }
    if (0 < (window->ColumnsStorage).Size) {
      bVar5 = TreeNode("Columns","Columns sets (%d)");
      if (bVar5) {
        if (0 < (window->ColumnsStorage).Size) {
          lVar18 = 0;
          do {
            pIVar14 = (window->ColumnsStorage).Data;
            bVar5 = TreeNode((void *)(ulong)pIVar14[lVar18].ID,
                             "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                             (void *)(ulong)pIVar14[lVar18].ID,(ulong)(uint)pIVar14[lVar18].Count,
                             (ulong)(uint)pIVar14[lVar18].Flags);
            if (bVar5) {
              pIVar14 = pIVar14 + lVar18;
              BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",
                         (double)(pIVar14->OffMaxX - pIVar14->OffMinX),(double)pIVar14->OffMinX,
                         (double)pIVar14->OffMaxX);
              if (0 < (pIVar14->Columns).Size) {
                lVar16 = 0;
                uVar8 = 0;
                do {
                  fVar3 = *(float *)((long)&((pIVar14->Columns).Data)->OffsetNorm + lVar16);
                  fVar19 = GetColumnOffsetFromNorm(pIVar14,fVar3);
                  BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar3,(double)fVar19
                             ,uVar8 & 0xffffffff);
                  uVar8 = uVar8 + 1;
                  lVar16 = lVar16 + 0x1c;
                } while ((long)uVar8 < (long)(pIVar14->Columns).Size);
              }
              TreePop();
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < (window->ColumnsStorage).Size);
        }
        TreePop();
      }
    }
    BulletText("Storage: %d bytes",(ulong)(uint)((window->StateStorage).Data.Size << 4));
    TreePop();
    return;
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y);
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.size_in_bytes());
            ImGui::TreePop();
        }